

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
addOneWayReference(UA_Server *server,UA_Session *session,UA_Node *node,UA_AddReferencesItem *item)

{
  UA_Logger p_Var1;
  UA_Logger p_Var2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  void *pvVar5;
  undefined8 *puVar6;
  long lVar7;
  
  p_Var2 = (server->config).logger;
  p_Var1 = p_Var2 + 1;
  pvVar5 = realloc((void *)(server->config).buildInfo.productUri.length,
                   ((long)p_Var1 * 0x10 | 0x30U) * 5);
  if (pvVar5 == (void *)0x0) {
    UVar4 = 0x80030000;
  }
  else {
    (server->config).buildInfo.productUri.length = (size_t)pvVar5;
    lVar7 = (long)p_Var2 * 0x50;
    puVar6 = (undefined8 *)((long)pvVar5 + lVar7 + 0x40);
    *puVar6 = 0;
    puVar6[1] = 0;
    puVar6 = (undefined8 *)((long)pvVar5 + lVar7 + 0x30);
    *puVar6 = 0;
    puVar6[1] = 0;
    puVar6 = (undefined8 *)((long)pvVar5 + lVar7 + 0x20);
    *puVar6 = 0;
    puVar6[1] = 0;
    puVar6 = (undefined8 *)((long)pvVar5 + lVar7 + 0x10);
    *puVar6 = 0;
    puVar6[1] = 0;
    *(undefined8 *)((long)pvVar5 + lVar7) = 0;
    ((undefined8 *)((long)pvVar5 + lVar7))[1] = 0;
    puVar6 = (undefined8 *)((long)pvVar5 + lVar7);
    UVar3 = UA_copy(&(session->clientDescription).productUri.data,puVar6,UA_TYPES + 0x10);
    UVar4 = UA_copy(&(session->clientDescription).gatewayServerUri,
                    (void *)((long)pvVar5 + lVar7 + 0x20),UA_TYPES + 0x11);
    UVar4 = UVar4 | UVar3;
    *(byte *)((long)pvVar5 + lVar7 + 0x18) =
         (byte)(session->clientDescription).applicationName.text.length ^ 1;
    if (UVar4 == 0) {
      (server->config).logger = p_Var1;
      UVar4 = 0;
    }
    else {
      deleteMembers_noInit(puVar6,UA_TYPES + 0x38);
      puVar6[8] = 0;
      puVar6[9] = 0;
      puVar6[6] = 0;
      puVar6[7] = 0;
      puVar6[4] = 0;
      puVar6[5] = 0;
      puVar6[2] = 0;
      puVar6[3] = 0;
      *puVar6 = 0;
      puVar6[1] = 0;
    }
  }
  return UVar4;
}

Assistant:

static UA_StatusCode
addOneWayReference(UA_Server *server, UA_Session *session,
                   UA_Node *node, const UA_AddReferencesItem *item) {
    size_t i = node->referencesSize;
    size_t refssize = (i+1) | 3; // so the realloc is not necessary every time
    UA_ReferenceNode *new_refs = UA_realloc(node->references, sizeof(UA_ReferenceNode) * refssize);
    if(!new_refs)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    node->references = new_refs;
    UA_ReferenceNode_init(&new_refs[i]);
    UA_StatusCode retval = UA_NodeId_copy(&item->referenceTypeId, &new_refs[i].referenceTypeId);
    retval |= UA_ExpandedNodeId_copy(&item->targetNodeId, &new_refs[i].targetId);
    new_refs[i].isInverse = !item->isForward;
    if(retval == UA_STATUSCODE_GOOD)
        node->referencesSize = i+1;
    else
        UA_ReferenceNode_deleteMembers(&new_refs[i]);
    return retval;
}